

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O0

void dlib::assign_tables<dlib::logger::global_data::auto_flush_container,bool>
               (auto_flush_container *c,string *name,bool *val)

{
  bool bVar1;
  long lVar2;
  bool *val_00;
  unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
  *this;
  pointer paVar3;
  string *in_RDX;
  auto_flush_container *in_RSI;
  byte *in_RDI;
  unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
  temp;
  string last;
  string first;
  size_type pos;
  domain *in_stack_00000168;
  map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  *in_stack_00000170;
  range *in_stack_000001a0;
  domain *in_stack_000001a8;
  map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  *in_stack_000001b0;
  pointer in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  byte bVar4;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    *in_RDI = (byte)*in_RDX & 1;
    map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::clear((map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             *)0x3da3ca);
  }
  else {
    val_00 = (bool *)std::__cxx11::string::find_first_of(&in_RSI->val,0x4e00c5);
    std::__cxx11::string::substr((ulong)local_40,(ulong)in_RSI);
    std::__cxx11::string::string(local_60);
    if (val_00 != (bool *)0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_80,(ulong)in_RSI);
      std::__cxx11::string::operator=(local_60,local_80);
      std::__cxx11::string::~string(local_80);
    }
    bVar1 = map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ::is_in_domain((map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                            *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffff38);
    if (bVar1) {
      map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      ::operator[](in_stack_00000170,in_stack_00000168);
      std::
      unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
      ::operator*((unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                   *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      assign_tables<dlib::logger::global_data::auto_flush_container,bool>(in_RSI,in_RDX,val_00);
    }
    else {
      this = (unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
              *)operator_new(0x78);
      logger::global_data::auto_flush_container::auto_flush_container
                ((auto_flush_container *)0x3da503);
      std::
      unique_ptr<dlib::logger::global_data::auto_flush_container,std::default_delete<dlib::logger::global_data::auto_flush_container>>
      ::unique_ptr<std::default_delete<dlib::logger::global_data::auto_flush_container>,void>
                ((unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                  *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      bVar4 = *in_RDI;
      paVar3 = std::
               unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
               ::operator->((unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                             *)0x3da531);
      paVar3->val = (bool)(bVar4 & 1);
      std::
      unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
      ::operator*((unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
                   *)CONCAT17(bVar4,in_stack_ffffffffffffff40));
      assign_tables<dlib::logger::global_data::auto_flush_container,bool>(in_RSI,in_RDX,val_00);
      map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      ::add(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
      std::
      unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
      ::~unique_ptr(this);
    }
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void assign_tables (
        T& c,
        const std::string& name,
        const U& val
    )
    {
        if (name.size() == 0)
        {
            c.val = val;
            c.table.clear();
            return;
        }

        const std::string::size_type pos = name.find_first_of(".");
        std::string first = name.substr(0,pos);
        std::string last;
        if (pos != std::string::npos)
            last = name.substr(pos+1);

        if (c.table.is_in_domain(first))
        {
            assign_tables(*c.table[first], last, val); 
        }
        else
        {
            std::unique_ptr<T> temp (new T);
            temp->val = c.val;
            assign_tables(*temp, last, val);
            c.table.add(first,temp);
        }
    }